

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_astExpression * new_identifier_expr(Context_conflict *ctx,char *string)

{
  MOJOSHADER_astExpression *pMVar1;
  
  pMVar1 = (MOJOSHADER_astExpression *)(*ctx->malloc)(0x30,ctx->malloc_data);
  if (pMVar1 == (MOJOSHADER_astExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar1 = (MOJOSHADER_astExpression *)0x0;
  }
  else {
    (pMVar1->ast).type = MOJOSHADER_AST_OP_IDENTIFIER;
    (pMVar1->ast).filename = ctx->sourcefile;
    (pMVar1->ast).line = ctx->sourceline;
    pMVar1->datatype = (MOJOSHADER_astDataType *)0x0;
    *(char **)&pMVar1[1].ast = string;
    *(undefined4 *)&pMVar1[1].ast.filename = 0;
  }
  return pMVar1;
}

Assistant:

static MOJOSHADER_astExpression *new_identifier_expr(Context *ctx,
                                                     const char *string)
{
    NEW_AST_NODE(retval, MOJOSHADER_astExpressionIdentifier,
                 MOJOSHADER_AST_OP_IDENTIFIER);
    retval->datatype = NULL;
    retval->identifier = string;  // cached; don't copy string.
    retval->index = 0;
    return (MOJOSHADER_astExpression *) retval;
}